

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

hwaddr cpu_mips_translate_address_mips(CPUMIPSState *env,target_ulong_conflict address,int rw)

{
  int iVar1;
  int ret;
  int access_type;
  int prot;
  hwaddr physical;
  int rw_local;
  target_ulong_conflict address_local;
  CPUMIPSState *env_local;
  
  physical._0_4_ = rw;
  physical._4_4_ = address;
  _rw_local = env;
  iVar1 = cpu_mmu_index(env,false);
  iVar1 = get_physical_address(env,(hwaddr *)&access_type,&ret,address,rw,0x20,iVar1);
  if (iVar1 == 0) {
    env_local = _access_type;
  }
  else {
    raise_mmu_exception(_rw_local,physical._4_4_,(int)physical,iVar1);
    env_local = (CPUMIPSState *)0xffffffffffffffff;
  }
  return (hwaddr)env_local;
}

Assistant:

hwaddr cpu_mips_translate_address(CPUMIPSState *env, target_ulong address,
                                  int rw)
{
    hwaddr physical;
    int prot;
    int access_type;
    int ret = 0;

    /* data access */
    access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address, rw, access_type,
                               cpu_mmu_index(env, false));
    if (ret != TLBRET_MATCH) {
        raise_mmu_exception(env, address, rw, ret);
        return -1LL;
    } else {
        return physical;
    }
}